

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O0

void __thiscall testForceOnSo3::test_method(testForceOnSo3 *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_318;
  assertion_result local_2f8;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_2c0;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_298 [24];
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> local_280 [24];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_268;
  RandomReturnType local_250;
  double local_240;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_238;
  Point local_200 [8];
  Point rot;
  int local_d4;
  undefined1 local_d0 [8];
  VectorXd randM;
  int local_ac;
  undefined1 local_a8 [8];
  VectorXd perturbedRotVec;
  S2 S;
  testForceOnSo3 *this_local;
  
  mnf::S2::S2((S2 *)&perturbedRotVec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  local_ac = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_a8,&local_ac);
  local_d4 = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_d0,&local_d4);
  mnf::Manifold::createRandomPoint(1.0);
  local_240 = 0.01;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random(&local_250,3);
  Eigen::operator*(&local_238,&local_240,(StorageBaseType *)&local_250);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)local_d0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_238);
  mnf::SubPoint::value();
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
  operator+(&local_268,local_280,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)local_a8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_268);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_298,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a8,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2c0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a8,(type *)0x0);
  mnf::Manifold::forceOnM
            (&perturbedRotVec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows,local_298,&local_2c0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_2c0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d0,0x5c,&local_2e0);
    bVar2 = mnf::Manifold::isInM
                      ((Matrix *)
                       &perturbedRotVec.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,1e-08);
    boost::test_tools::assertion_result::assertion_result(&local_2f8,(bool)(bVar2 & 1));
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,"S.isInM(perturbedRotVec)",0x18);
    boost::unit_test::operator<<(&local_318,prev,&local_328);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
               ,0x67);
    boost::test_tools::tt_detail::report_assertion(&local_2f8,&local_318,&local_338,0x5c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_318);
    boost::test_tools::assertion_result::~assertion_result(&local_2f8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  mnf::Point::~Point(local_200);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a8);
  mnf::S2::~S2((S2 *)&perturbedRotVec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      .m_storage.m_rows);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testForceOnSo3)
{
  S2 S;
  Eigen::VectorXd perturbedRotVec(3);
  Eigen::VectorXd randM(3);
  Point rot = S.createRandomPoint();
  randM = 0.01 * Eigen::VectorXd::Random(3);
  perturbedRotVec = rot.value() + randM;
  S.forceOnM(perturbedRotVec, perturbedRotVec);
  BOOST_CHECK(S.isInM(perturbedRotVec));
}